

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QControlledGate2<std::complex<float>_>::apply
          (QControlledGate2<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  float fVar1;
  complex<float> cVar2;
  _ComplexT_conflict _Var3;
  complex<float> *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  QControlledGate2<std::complex<float>_> *pQVar15;
  char *__assertion;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  ulong uVar23;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  matrix_type mat1;
  vector<int,_std::allocator<int>_> qubits;
  long local_f0;
  long local_c0;
  SquareMatrix<std::complex<float>_> local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  QControlledGate2<std::complex<float>_> *local_98;
  long local_90;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  int *local_60 [2];
  long local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_98 = this;
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[5])
            (local_60);
  pQVar15 = local_98;
  iVar5 = *local_60[0];
  *local_60[0] = iVar5 + offset;
  iVar6 = local_60[0][1];
  local_60[0][1] = offset + iVar6;
  if (iVar5 + offset < nbQubits) {
    if (offset + iVar6 < nbQubits) {
      iVar5 = (*(local_98->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                _vptr_QObject[0x10])(local_98);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x38))
                (&local_b8,(long *)CONCAT44(extraout_var,iVar5));
      dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(op,&local_b8);
      iVar5 = pQVar15->control_;
      iVar6 = (*(pQVar15->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                _vptr_QObject[0xf])(pQVar15);
      if (iVar5 < iVar6) {
        iVar6 = (*(pQVar15->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                  _vptr_QObject[0xf])(pQVar15);
        iVar5 = pQVar15->control_;
        iVar7 = (*(pQVar15->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                  _vptr_QObject[0xf])(pQVar15);
        uVar8 = (*(pQVar15->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                  _vptr_QObject[0xf])(pQVar15);
        lVar16 = (long)(1 << ((char)iVar6 - (char)iVar5 & 0x1fU));
        iVar5 = ~uVar8 + nbQubits;
        lVar9 = (long)(1 << ((byte)iVar7 & 0x1f));
        lVar17 = (long)(1 << ((byte)iVar5 & 0x1f));
        if (side == Left) {
          if (0 < matrix->size_) {
            lVar12 = 1;
            if (1 < lVar17) {
              lVar12 = lVar17;
            }
            lVar13 = 1;
            if (1 < lVar9) {
              lVar13 = lVar9;
            }
            lVar9 = 0;
            do {
              if (iVar7 != 0x1f) {
                local_90 = 0;
                local_c0 = 0;
                do {
                  if (local_98->controlState_ == 1) {
                    if (lVar16 / 2 <= local_c0 % lVar16) goto LAB_001114b6;
                  }
                  else if ((local_98->controlState_ != 0) || (local_c0 % lVar16 < lVar16 / 2)) {
LAB_001114b6:
                    lVar19 = local_90;
                    lVar18 = lVar12;
                    if (iVar5 != 0x1f) {
                      do {
                        pcVar4 = (matrix->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                        lVar14 = matrix->size_ * lVar19;
                        fVar21 = *(float *)&pcVar4[lVar14 + lVar9]._M_value;
                        fVar26 = *(float *)((long)&pcVar4[lVar14 + lVar9]._M_value + 4);
                        lVar14 = matrix->size_ * (lVar19 + lVar17);
                        fVar1 = *(float *)&pcVar4[lVar14 + lVar9]._M_value;
                        fVar28 = *(float *)((long)&pcVar4[lVar14 + lVar9]._M_value + 4);
                        cVar2._M_value =
                             *(_ComplexT_conflict *)
                              local_b8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                        fVar20 = (float)(cVar2._M_value >> 0x20);
                        uVar30 = 0;
                        uVar31 = 0;
                        fVar29 = fVar21 * (float)cVar2._M_value - fVar26 * fVar20;
                        fVar33 = fVar21 * fVar20 + fVar26 * (float)cVar2._M_value;
                        fVar34 = 0.0;
                        if ((NAN(fVar29)) && (NAN(fVar33))) {
                          local_a8 = fVar21;
                          uVar22 = __mulsc3(cVar2._M_value,fVar20,fVar21,fVar26);
                          fVar29 = (float)uVar22;
                          fVar33 = (float)((ulong)uVar22 >> 0x20);
                          uVar30 = (undefined4)extraout_XMM0_Qb;
                          uVar31 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
                          fVar21 = local_a8;
                          fVar34 = fVar33;
                        }
                        _Var3 = ((complex<float> *)
                                ((long)local_b8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + 8))->_M_value;
                        fVar32 = (float)(_Var3 >> 0x20);
                        fVar20 = fVar1 * (float)_Var3 - fVar28 * fVar32;
                        uVar23 = (ulong)(uint)fVar20;
                        fVar25 = fVar1 * fVar32 + fVar28 * (float)_Var3;
                        if ((NAN(fVar20)) && (NAN(fVar25))) {
                          local_a8 = fVar21;
                          local_88 = fVar29;
                          fStack_84 = fVar34;
                          uStack_80 = uVar30;
                          uStack_7c = uVar31;
                          local_78 = fVar33;
                          fStack_74 = fVar34;
                          fStack_70 = fVar34;
                          fStack_6c = fVar34;
                          uVar23 = __mulsc3(_Var3,fVar32,fVar1,fVar28);
                          fVar25 = (float)(uVar23 >> 0x20);
                          fVar21 = local_a8;
                          fVar29 = local_88;
                          fVar33 = local_78;
                        }
                        (matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                        .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                        [matrix->size_ * lVar19 + lVar9]._M_value =
                             CONCAT44(fVar33 + fVar25,fVar29 + (float)uVar23);
                        _Var3 = ((complex<float> *)
                                ((long)local_b8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + local_b8.size_ * 8))->_M_value;
                        fVar33 = (float)(_Var3 >> 0x20);
                        fVar29 = fVar21 * (float)_Var3 - fVar26 * fVar33;
                        fVar34 = fVar21 * fVar33 + fVar26 * (float)_Var3;
                        if ((NAN(fVar29)) && (NAN(fVar34))) {
                          uVar22 = __mulsc3(_Var3,fVar33,fVar21,fVar26);
                          fVar29 = (float)uVar22;
                          fVar34 = (float)((ulong)uVar22 >> 0x20);
                        }
                        _Var3 = ((complex<float> *)
                                ((long)local_b8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + 8))[local_b8.size_]._M_value;
                        fVar33 = (float)(_Var3 >> 0x20);
                        fVar21 = fVar1 * (float)_Var3 - fVar28 * fVar33;
                        uVar23 = (ulong)(uint)fVar21;
                        fVar26 = fVar1 * fVar33 + fVar28 * (float)_Var3;
                        if ((NAN(fVar21)) && (NAN(fVar26))) {
                          uVar23 = __mulsc3(_Var3,fVar33,fVar1,fVar28);
                          fVar26 = (float)(uVar23 >> 0x20);
                        }
                        (matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                        .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                        [(lVar19 + lVar17) * matrix->size_ + lVar9]._M_value =
                             CONCAT44(fVar34 + fVar26,fVar29 + (float)uVar23);
                        lVar18 = lVar18 + -1;
                        lVar19 = lVar19 + 1;
                      } while (lVar18 != 0);
                    }
                  }
                  local_c0 = local_c0 + 1;
                  local_90 = local_90 + lVar17 * 2;
                } while (local_c0 != lVar13);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < matrix->size_);
          }
        }
        else if (0 < matrix->size_) {
          lVar12 = 1;
          if (1 < lVar17) {
            lVar12 = lVar17;
          }
          lVar13 = 1;
          if (1 < lVar9) {
            lVar13 = lVar9;
          }
          lVar19 = 0;
          lVar9 = 0;
          do {
            local_90 = lVar9;
            if (iVar7 != 0x1f) {
              lVar9 = 0;
              lVar18 = 0;
              do {
                if (local_98->controlState_ == 1) {
                  if (lVar16 / 2 <= lVar18 % lVar16) goto LAB_00112336;
                }
                else if ((local_98->controlState_ != 0) || (lVar18 % lVar16 < lVar16 / 2)) {
LAB_00112336:
                  lVar14 = lVar12;
                  lVar10 = lVar9;
                  if (iVar5 != 0x1f) {
                    do {
                      lVar11 = matrix->size_ * lVar19;
                      pcVar4 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      fVar21 = *(float *)((long)&pcVar4->_M_value + lVar10 + lVar11);
                      fVar26 = *(float *)((long)&pcVar4->_M_value + lVar10 + 4 + lVar11);
                      fVar1 = *(float *)((long)&pcVar4[lVar17]._M_value + lVar10 + lVar11);
                      fVar28 = *(float *)((long)&pcVar4[lVar17]._M_value + lVar10 + lVar11 + 4);
                      cVar2._M_value =
                           *(_ComplexT_conflict *)
                            local_b8.data_._M_t.
                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                            .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      fVar20 = (float)(cVar2._M_value >> 0x20);
                      uVar30 = 0;
                      uVar31 = 0;
                      fVar29 = fVar21 * (float)cVar2._M_value - fVar26 * fVar20;
                      fVar33 = fVar21 * fVar20 + fVar26 * (float)cVar2._M_value;
                      fVar34 = 0.0;
                      if ((NAN(fVar29)) && (NAN(fVar33))) {
                        local_a8 = fVar21;
                        uVar22 = __mulsc3(cVar2._M_value,fVar20,fVar21,fVar26);
                        fVar29 = (float)uVar22;
                        fVar33 = (float)((ulong)uVar22 >> 0x20);
                        uVar30 = (undefined4)extraout_XMM0_Qb_02;
                        uVar31 = (undefined4)((ulong)extraout_XMM0_Qb_02 >> 0x20);
                        fVar21 = local_a8;
                        fVar34 = fVar33;
                      }
                      _Var3 = ((complex<float> *)
                              ((long)local_b8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + local_b8.size_ * 8))->_M_value;
                      fVar32 = (float)(_Var3 >> 0x20);
                      fVar20 = fVar1 * (float)_Var3 - fVar28 * fVar32;
                      uVar23 = (ulong)(uint)fVar20;
                      fVar25 = fVar1 * fVar32 + fVar28 * (float)_Var3;
                      if ((NAN(fVar20)) && (NAN(fVar25))) {
                        local_a8 = fVar21;
                        local_88 = fVar29;
                        fStack_84 = fVar34;
                        uStack_80 = uVar30;
                        uStack_7c = uVar31;
                        local_78 = fVar33;
                        fStack_74 = fVar34;
                        fStack_70 = fVar34;
                        fStack_6c = fVar34;
                        uVar23 = __mulsc3(_Var3,fVar32,fVar1,fVar28);
                        fVar25 = (float)(uVar23 >> 0x20);
                        fVar21 = local_a8;
                        fVar29 = local_88;
                        fVar33 = local_78;
                      }
                      *(ulong *)((long)&((matrix->data_)._M_t.
                                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                         .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl)->_M_value + lVar10 + matrix->size_ * lVar19) =
                           CONCAT44(fVar33 + fVar25,fVar29 + (float)uVar23);
                      _Var3 = ((complex<float> *)
                              ((long)local_b8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 8))->_M_value;
                      fVar33 = (float)(_Var3 >> 0x20);
                      fVar29 = fVar21 * (float)_Var3 - fVar26 * fVar33;
                      fVar34 = fVar21 * fVar33 + fVar26 * (float)_Var3;
                      if ((NAN(fVar29)) && (NAN(fVar34))) {
                        uVar22 = __mulsc3(_Var3,fVar33,fVar21,fVar26);
                        fVar29 = (float)uVar22;
                        fVar34 = (float)((ulong)uVar22 >> 0x20);
                      }
                      _Var3 = ((complex<float> *)
                              ((long)local_b8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 8))[local_b8.size_]._M_value;
                      fVar33 = (float)(_Var3 >> 0x20);
                      fVar21 = fVar1 * (float)_Var3 - fVar28 * fVar33;
                      uVar23 = (ulong)(uint)fVar21;
                      fVar26 = fVar1 * fVar33 + fVar28 * (float)_Var3;
                      if ((NAN(fVar21)) && (NAN(fVar26))) {
                        uVar23 = __mulsc3(_Var3,fVar33,fVar1,fVar28);
                        fVar26 = (float)(uVar23 >> 0x20);
                      }
                      *(ulong *)((long)&(matrix->data_)._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl[lVar17]._M_value +
                                lVar10 + matrix->size_ * lVar19) =
                           CONCAT44(fVar34 + fVar26,fVar29 + (float)uVar23);
                      lVar14 = lVar14 + -1;
                      lVar10 = lVar10 + 8;
                    } while (lVar14 != 0);
                  }
                }
                lVar18 = lVar18 + 1;
                lVar9 = lVar9 + lVar17 * 0x10;
              } while (lVar18 != lVar13);
            }
            lVar9 = local_90 + 1;
            lVar19 = lVar19 + 8;
          } while (lVar9 < matrix->size_);
        }
      }
      else {
        iVar5 = pQVar15->control_;
        iVar6 = (*(pQVar15->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                  _vptr_QObject[0xf])(pQVar15);
        uVar8 = (*(pQVar15->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                  _vptr_QObject[0xf])(pQVar15);
        lVar16 = (long)(1 << ((byte)nbQubits - (char)iVar5 & 0x1f));
        iVar5 = ~uVar8 + nbQubits;
        lVar9 = (long)(1 << ((byte)iVar6 & 0x1f));
        lVar17 = (long)(1 << ((byte)iVar5 & 0x1f));
        if (side == Left) {
          if (0 < matrix->size_) {
            lVar12 = 1;
            if (1 < lVar17) {
              lVar12 = lVar17;
            }
            lVar13 = 1;
            if (1 < lVar9) {
              lVar13 = lVar9;
            }
            lVar9 = 0;
            do {
              if (iVar6 != 0x1f) {
                lVar18 = 0;
                lVar19 = 0;
                pQVar15 = local_98;
                do {
                  if (iVar5 != 0x1f) {
                    local_90 = lVar17 + lVar18;
                    lVar14 = 0;
                    do {
                      if (pQVar15->controlState_ == 1) {
                        if (lVar16 / 2 <= lVar14 % lVar16) goto LAB_001119de;
                      }
                      else if ((pQVar15->controlState_ != 0) || (lVar14 % lVar16 < lVar16 / 2)) {
LAB_001119de:
                        lVar10 = local_90 + lVar14;
                        pcVar4 = (matrix->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                        lVar11 = matrix->size_ * (lVar14 + lVar18);
                        fVar21 = *(float *)&pcVar4[lVar11 + lVar9]._M_value;
                        fVar26 = *(float *)((long)&pcVar4[lVar11 + lVar9]._M_value + 4);
                        lVar11 = matrix->size_ * lVar10;
                        fVar1 = *(float *)&pcVar4[lVar11 + lVar9]._M_value;
                        fVar28 = *(float *)((long)&pcVar4[lVar11 + lVar9]._M_value + 4);
                        cVar2._M_value =
                             *(_ComplexT_conflict *)
                              local_b8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                        fVar20 = (float)(cVar2._M_value >> 0x20);
                        fVar25 = 0.0;
                        fVar32 = 0.0;
                        fVar29 = fVar21 * (float)cVar2._M_value - fVar26 * fVar20;
                        fVar33 = fVar21 * fVar20 + fVar26 * (float)cVar2._M_value;
                        fVar34 = 0.0;
                        if ((NAN(fVar29)) && (NAN(fVar33))) {
                          local_a8 = fVar28;
                          local_88 = fVar26;
                          uVar22 = __mulsc3(cVar2._M_value,fVar20,fVar21,fVar26);
                          fVar29 = (float)uVar22;
                          fVar33 = (float)((ulong)uVar22 >> 0x20);
                          fVar25 = (float)extraout_XMM0_Qb_00;
                          fVar32 = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
                          fVar28 = local_a8;
                          fVar26 = local_88;
                          fVar34 = fVar33;
                        }
                        _Var3 = ((complex<float> *)
                                ((long)local_b8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + 8))->_M_value;
                        fVar24 = (float)(_Var3 >> 0x20);
                        fVar20 = fVar1 * (float)_Var3 - fVar28 * fVar24;
                        uVar23 = (ulong)(uint)fVar20;
                        fVar27 = fVar1 * fVar24 + fVar28 * (float)_Var3;
                        if ((NAN(fVar20)) && (NAN(fVar27))) {
                          local_a8 = fVar28;
                          local_88 = fVar26;
                          local_78 = fVar29;
                          fStack_74 = fVar34;
                          fStack_70 = fVar25;
                          fStack_6c = fVar32;
                          local_48 = fVar33;
                          fStack_44 = fVar34;
                          fStack_40 = fVar34;
                          fStack_3c = fVar34;
                          uVar23 = __mulsc3(_Var3,fVar24,fVar1,fVar28);
                          fVar27 = (float)(uVar23 >> 0x20);
                          fVar28 = local_a8;
                          fVar26 = local_88;
                          fVar29 = local_78;
                          fVar33 = local_48;
                        }
                        pQVar15 = local_98;
                        (matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                        .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                        [(lVar14 + lVar18) * matrix->size_ + lVar9]._M_value =
                             CONCAT44(fVar33 + fVar27,fVar29 + (float)uVar23);
                        _Var3 = ((complex<float> *)
                                ((long)local_b8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + local_b8.size_ * 8))->_M_value;
                        fVar20 = (float)(_Var3 >> 0x20);
                        fVar34 = fVar21 * (float)_Var3 - fVar26 * fVar20;
                        fVar33 = 0.0;
                        fVar29 = fVar21 * fVar20 + fVar26 * (float)_Var3;
                        if ((NAN(fVar34)) && (NAN(fVar29))) {
                          local_a8 = fVar28;
                          uVar22 = __mulsc3(_Var3,fVar20,fVar21,fVar26);
                          fVar34 = (float)uVar22;
                          fVar29 = (float)((ulong)uVar22 >> 0x20);
                          fVar28 = local_a8;
                          fVar33 = fVar29;
                        }
                        _Var3 = ((complex<float> *)
                                ((long)local_b8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + (local_b8.size_ + 1) * 8))->_M_value;
                        fVar20 = (float)(_Var3 >> 0x20);
                        fVar21 = fVar1 * (float)_Var3 - fVar28 * fVar20;
                        uVar23 = (ulong)(uint)fVar21;
                        fVar26 = fVar1 * fVar20 + fVar28 * (float)_Var3;
                        if ((NAN(fVar21)) && (NAN(fVar26))) {
                          local_a8 = fVar29;
                          fStack_a4 = fVar33;
                          fStack_a0 = fVar33;
                          fStack_9c = fVar33;
                          uVar23 = __mulsc3(_Var3,fVar20,fVar1,fVar28);
                          fVar26 = (float)(uVar23 >> 0x20);
                          fVar29 = local_a8;
                        }
                        (matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                        .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                        [lVar10 * matrix->size_ + lVar9]._M_value =
                             CONCAT44(fVar29 + fVar26,fVar34 + (float)uVar23);
                      }
                      lVar14 = lVar14 + 1;
                    } while (lVar12 != lVar14);
                  }
                  lVar19 = lVar19 + 1;
                  lVar18 = lVar18 + lVar17 * 2;
                } while (lVar19 != lVar13);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < matrix->size_);
          }
        }
        else if (0 < matrix->size_) {
          lVar12 = 1;
          if (1 < lVar17) {
            lVar12 = lVar17;
          }
          lVar13 = 1;
          if (1 < lVar9) {
            lVar13 = lVar9;
          }
          lVar9 = 0;
          do {
            if (iVar6 != 0x1f) {
              local_f0 = 0;
              pQVar15 = local_98;
              do {
                if (iVar5 != 0x1f) {
                  local_90 = lVar17 * 2 * local_f0;
                  lVar19 = 0;
                  do {
                    if (pQVar15->controlState_ == 1) {
                      if (lVar16 / 2 <= lVar19 % lVar16) goto LAB_00111ec3;
                    }
                    else if ((pQVar15->controlState_ != 0) || (lVar19 % lVar16 < lVar16 / 2)) {
LAB_00111ec3:
                      lVar18 = lVar19 + local_90;
                      lVar14 = lVar17 + lVar18;
                      lVar10 = matrix->size_ * lVar9;
                      pcVar4 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      fVar21 = *(float *)&pcVar4[lVar10 + lVar18]._M_value;
                      fVar26 = *(float *)((long)&pcVar4[lVar10 + lVar18]._M_value + 4);
                      fVar1 = *(float *)&pcVar4[lVar10 + lVar14]._M_value;
                      fVar28 = *(float *)((long)&pcVar4[lVar10 + lVar14]._M_value + 4);
                      _Var3 = *(_ComplexT_conflict *)
                               local_b8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      fVar20 = (float)(_Var3 >> 0x20);
                      uVar30 = 0;
                      uVar31 = 0;
                      fVar29 = fVar21 * (float)_Var3 - fVar26 * fVar20;
                      fVar33 = fVar21 * fVar20 + fVar26 * (float)_Var3;
                      fVar34 = 0.0;
                      if ((NAN(fVar29)) && (NAN(fVar33))) {
                        local_a8 = fVar21;
                        uVar22 = __mulsc3(_Var3,fVar20,fVar21,fVar26);
                        fVar29 = (float)uVar22;
                        fVar33 = (float)((ulong)uVar22 >> 0x20);
                        uVar30 = (undefined4)extraout_XMM0_Qb_01;
                        uVar31 = (undefined4)((ulong)extraout_XMM0_Qb_01 >> 0x20);
                        fVar21 = local_a8;
                        fVar34 = fVar33;
                      }
                      _Var3 = ((complex<float> *)
                              ((long)local_b8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + local_b8.size_ * 8))->_M_value;
                      fVar32 = (float)(_Var3 >> 0x20);
                      fVar20 = fVar1 * (float)_Var3 - fVar28 * fVar32;
                      uVar23 = (ulong)(uint)fVar20;
                      fVar25 = fVar1 * fVar32 + fVar28 * (float)_Var3;
                      if ((NAN(fVar20)) && (NAN(fVar25))) {
                        local_a8 = fVar21;
                        local_88 = fVar29;
                        fStack_84 = fVar34;
                        uStack_80 = uVar30;
                        uStack_7c = uVar31;
                        local_78 = fVar33;
                        fStack_74 = fVar34;
                        fStack_70 = fVar34;
                        fStack_6c = fVar34;
                        uVar23 = __mulsc3(_Var3,fVar32,fVar1,fVar28);
                        fVar25 = (float)(uVar23 >> 0x20);
                        fVar21 = local_a8;
                        fVar29 = local_88;
                        fVar33 = local_78;
                      }
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [matrix->size_ * lVar9 + lVar18]._M_value =
                           CONCAT44(fVar33 + fVar25,fVar29 + (float)uVar23);
                      _Var3 = ((complex<float> *)
                              ((long)local_b8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 8))->_M_value;
                      fVar33 = (float)(_Var3 >> 0x20);
                      fVar29 = fVar21 * (float)_Var3 - fVar26 * fVar33;
                      fVar34 = fVar21 * fVar33 + fVar26 * (float)_Var3;
                      if ((NAN(fVar29)) && (NAN(fVar34))) {
                        uVar22 = __mulsc3(_Var3,fVar33,fVar21,fVar26);
                        fVar29 = (float)uVar22;
                        fVar34 = (float)((ulong)uVar22 >> 0x20);
                      }
                      _Var3 = ((complex<float> *)
                              ((long)local_b8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + (local_b8.size_ + 1) * 8))->_M_value;
                      fVar33 = (float)(_Var3 >> 0x20);
                      fVar21 = fVar1 * (float)_Var3 - fVar28 * fVar33;
                      uVar23 = (ulong)(uint)fVar21;
                      fVar26 = fVar1 * fVar33 + fVar28 * (float)_Var3;
                      if ((NAN(fVar21)) && (NAN(fVar26))) {
                        uVar23 = __mulsc3(_Var3,fVar33,fVar1,fVar28);
                        fVar26 = (float)(uVar23 >> 0x20);
                      }
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [matrix->size_ * lVar9 + lVar14]._M_value =
                           CONCAT44(fVar34 + fVar26,fVar29 + (float)uVar23);
                      pQVar15 = local_98;
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != lVar12);
                }
                local_f0 = local_f0 + 1;
              } while (local_f0 != lVar13);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < matrix->size_);
        }
      }
      if ((_Head_base<0UL,_std::complex<float>_*,_false>)
          local_b8.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
        operator_delete__((void *)local_b8.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)
        ;
      }
      if (local_60[0] != (int *)0x0) {
        operator_delete(local_60[0],local_50 - (long)local_60[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                ,0x33,
                "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
               );
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }